

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_clamp(ImGuiTextEditState *str,STB_TexteditState *state)

{
  int iVar1;
  int n;
  STB_TexteditState *state_local;
  ImGuiTextEditState *str_local;
  
  iVar1 = STB_TEXTEDIT_STRINGLEN(str);
  if (state->select_start != state->select_end) {
    if (iVar1 < state->select_start) {
      state->select_start = iVar1;
    }
    if (iVar1 < state->select_end) {
      state->select_end = iVar1;
    }
    if (state->select_start == state->select_end) {
      state->cursor = state->select_start;
    }
  }
  if (iVar1 < state->cursor) {
    state->cursor = iVar1;
  }
  return;
}

Assistant:

static void stb_textedit_clamp(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   int n = STB_TEXTEDIT_STRINGLEN(str);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start > n) state->select_start = n;
      if (state->select_end   > n) state->select_end = n;
      // if clamping forced them to be equal, move the cursor to match
      if (state->select_start == state->select_end)
         state->cursor = state->select_start;
   }
   if (state->cursor > n) state->cursor = n;
}